

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void dequantize_row_iq1_s(block_iq1_s *x,float *y,int64_t k)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  ushort uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined6 uVar9;
  undefined1 auVar10 [12];
  long lVar11;
  long lVar12;
  uint8_t *puVar13;
  long lVar14;
  int ib;
  long lVar15;
  int l;
  long lVar16;
  float fVar17;
  short sVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 uVar22;
  undefined2 uVar23;
  
  lVar11 = k + 0xff;
  if (-1 < k) {
    lVar11 = k;
  }
  if (0xff < k) {
    lVar12 = 0;
    do {
      puVar13 = x[lVar12].qs;
      fVar2 = ggml_table_f32_f16[x[lVar12].d];
      lVar15 = 0;
      do {
        uVar5 = x[lVar12].qh[lVar15];
        fVar17 = (float)(ushort)((uVar5 >> 0xb & 0xe) + 1) * fVar2;
        fVar3 = *(float *)(&DAT_0014ebec + (ulong)(-1 < (short)uVar5) * 4);
        lVar16 = 0;
        do {
          bVar4 = puVar13[lVar16];
          lVar14 = 0;
          do {
            uVar6 = *(undefined4 *)
                     ((long)iq1s_grid +
                     lVar14 + (ulong)((uVar5 >> ((char)lVar16 * '\x03' & 0x1fU) & 7) << 8 |
                                     (uint)bVar4) * 8);
            uVar22 = (undefined1)((uint)uVar6 >> 0x18);
            uVar23 = CONCAT11(uVar22,uVar22);
            uVar22 = (undefined1)((uint)uVar6 >> 0x10);
            uVar7 = CONCAT35(CONCAT21(uVar23,uVar22),CONCAT14(uVar22,uVar6));
            uVar22 = (undefined1)((uint)uVar6 >> 8);
            uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar7 >> 0x20),uVar22),uVar22);
            sVar18 = CONCAT11((char)uVar6,(char)uVar6);
            uVar8 = CONCAT62(uVar9,sVar18);
            auVar21._8_4_ = 0;
            auVar21._0_8_ = uVar8;
            auVar21._12_2_ = uVar23;
            auVar21._14_2_ = uVar23;
            uVar23 = (undefined2)((ulong)uVar7 >> 0x20);
            auVar20._12_4_ = auVar21._12_4_;
            auVar20._8_2_ = 0;
            auVar20._0_8_ = uVar8;
            auVar20._10_2_ = uVar23;
            auVar19._10_6_ = auVar20._10_6_;
            auVar19._8_2_ = uVar23;
            auVar19._0_8_ = uVar8;
            uVar23 = (undefined2)uVar9;
            auVar10._4_8_ = auVar19._8_8_;
            auVar10._2_2_ = uVar23;
            auVar10._0_2_ = uVar23;
            pfVar1 = y + lVar14;
            *pfVar1 = ((float)((int)sVar18 >> 8) + fVar3) * fVar17;
            pfVar1[1] = ((float)(auVar10._0_4_ >> 0x18) + fVar3) * fVar17;
            pfVar1[2] = ((float)(auVar19._8_4_ >> 0x18) + fVar3) * fVar17;
            pfVar1[3] = ((float)(auVar20._12_4_ >> 0x18) + fVar3) * fVar17;
            lVar14 = lVar14 + 4;
          } while (lVar14 != 8);
          y = y + 8;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        puVar13 = puVar13 + 4;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 8);
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar11 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_iq1_s(const block_iq1_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t  * qs = x[i].qs;
        const uint16_t * qh = x[i].qh;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float dl = d * (2*((qh[ib] >> 12) & 7) + 1);
            const float delta = qh[ib] & 0x8000 ? -IQ1S_DELTA : IQ1S_DELTA;
            for (int l = 0; l < 4; ++l) {
                const int8_t * grid = (const int8_t *)(iq1s_grid + (qs[l] | (((qh[ib] >> 3*l) & 7) << 8)));
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl * (grid[j] + delta);
                }
                y += 8;
            }
            qs += 4;
        }
    }
}